

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O3

int Dau_DsdToGia(Gia_Man_t *pGia,char *p,int *pLits,Vec_Int_t *vCover)

{
  int iVar1;
  int *pMatches;
  char *local_30;
  
  if (*p == '1') {
    if (p[1] == '\0') {
      iVar1 = 1;
      goto LAB_00519276;
    }
  }
  else if ((*p == '0') && (p[1] == '\0')) {
    iVar1 = 0;
    goto LAB_00519276;
  }
  local_30 = p;
  pMatches = Dau_DsdComputeMatches(p);
  iVar1 = Dau_DsdToGia_rec(pGia,p,&local_30,pMatches,pLits,vCover);
  p = local_30;
LAB_00519276:
  local_30 = p + 1;
  if (p[1] == '\0') {
    return iVar1;
  }
  __assert_fail("*++p == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                ,0x1aa,"int Dau_DsdToGia(Gia_Man_t *, char *, int *, Vec_Int_t *)");
}

Assistant:

int Dau_DsdToGia( Gia_Man_t * pGia, char * p, int * pLits, Vec_Int_t * vCover )
{
    int Res;
    if ( *p == '0' && *(p+1) == 0 )
        Res = 0;
    else if ( *p == '1' && *(p+1) == 0 )
        Res = 1;
    else
        Res = Dau_DsdToGia_rec( pGia, p, &p, Dau_DsdComputeMatches(p), pLits, vCover );
    assert( *++p == 0 );
    return Res;
}